

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nocaseCollatingFunc(void *NotUsed,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  char *in_R8;
  int r;
  int local_44;
  int local_2c;
  
  local_44 = in_ECX;
  if (in_ESI < in_ECX) {
    local_44 = in_ESI;
  }
  local_2c = sqlite3_strnicmp(in_RDX,in_R8,local_44);
  if (local_2c == 0) {
    local_2c = in_ESI - in_ECX;
  }
  return local_2c;
}

Assistant:

static int nocaseCollatingFunc(
  void *NotUsed,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int r = sqlite3StrNICmp(
      (const char *)pKey1, (const char *)pKey2, (nKey1<nKey2)?nKey1:nKey2);
  UNUSED_PARAMETER(NotUsed);
  if( 0==r ){
    r = nKey1-nKey2;
  }
  return r;
}